

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

ostream * operator<<(ostream *os,ipv4_address *addr)

{
  char *__s;
  size_t sVar1;
  
  __s = inet_ntoa((in_addr)addr->addr_net);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_address const& addr)
{
    in_addr tmp{};
    tmp.s_addr = addr.addr_net;
    os << inet_ntoa(tmp);
    return os;
}